

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetNrStates::operator()
          (SetNrStates *this,iterator_t *str,iterator_t *end)

{
  undefined8 uVar1;
  MultiAgentDecisionProcessDiscrete *in_RDI;
  E *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  
  if (((byte)(in_RDI->super_MultiAgentDecisionProcess)._m_name._m_name._M_dataplus & 1) == 0) {
    if (*(int *)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x40) != 2) {
      uVar1 = __cxa_allocate_exception(0x28);
      E::E(unaff_retaddr,(char *)in_RDI);
      __cxa_throw(uVar1,&E::typeinfo,E::~E);
    }
    GetDecPOMDPDiscrete(*(ParserDPOMDPFormat_Spirit **)&in_RDI->super_MultiAgentDecisionProcess);
    MultiAgentDecisionProcessDiscrete::SetNrStates(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    GetDecPOMDPDiscrete(*(ParserDPOMDPFormat_Spirit **)&in_RDI->super_MultiAgentDecisionProcess);
    MultiAgentDecisionProcessDiscrete::SetNrStates(in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_haveTarget)
                    _m_po->GetDecPOMDPDiscrete()->SetNrStates(_m_target);
                else if(_m_po->_m_lp_type == UINT)// || _m_lp_type
                    _m_po->GetDecPOMDPDiscrete()->SetNrStates(_m_po->_m_lp_uint);
                else
                    throw E("SetNrStates: no target value set and last parsed data type != UINT...");
            }